

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsCreators.cpp
# Opt level: O3

void chrono::utils::AddConvexCollisionModel
               (shared_ptr<chrono::ChBody> *body,shared_ptr<chrono::ChMaterialSurface> *material,
               shared_ptr<chrono::geometry::ChTriangleMeshConnected> *convex_mesh,
               vector<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>_>
               *convex_hulls,ChVector<double> *pos,ChQuaternion<double> *rot,
               shared_ptr<chrono::ChVisualMaterial> *vis_material)

{
  double dVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  pointer pvVar3;
  element_type *this;
  ulong uVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  ChTriangleMeshShape *this_00;
  ulong uVar6;
  element_type *peVar7;
  long lVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  shared_ptr<chrono::ChTriangleMeshShape> trimesh_shape;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_150;
  ChVector<double> *local_148;
  ChQuaternion<double> *local_140;
  undefined1 local_138 [24];
  undefined1 auStack_120 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_110;
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> local_108;
  element_type *local_f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_f0;
  pointer local_e0;
  pointer local_d8;
  element_type *local_d0;
  ChVisualModel *local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  undefined1 local_b8 [40];
  double local_90;
  double dStack_88;
  double local_80;
  ChMatrix33<double> local_78;
  
  local_148 = pos;
  local_140 = rot;
  local_e0 = (pointer)convex_mesh;
  local_d8 = (pointer)material;
  if ((convex_hulls->
      super__Vector_base<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (convex_hulls->
      super__Vector_base<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    lVar8 = 0;
    uVar6 = 0;
    do {
      peVar7 = (body->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_d0 = (peVar7->collision_model).
                 super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
      p_Var5 = (peVar7->collision_model).
               super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
        }
      }
      local_f8 = (local_d8->super___shared_ptr<chrono::ChCamera,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
      ;
      _Stack_f0._M_pi =
           (local_d8->super___shared_ptr<chrono::ChCamera,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
      p_Var2 = (local_d8->super___shared_ptr<chrono::ChCamera,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
      }
      pvVar3 = (convex_hulls->
               super__Vector_base<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      ChMatrix33<double>::ChMatrix33((ChMatrix33<double> *)local_b8,local_140);
      (*local_d0->_vptr_ChCollisionModel[0xf])
                (local_d0,&local_f8,
                 (long)&(pvVar3->
                        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + lVar8,local_148,
                 (ChMatrix33<double> *)local_b8);
      if (_Stack_f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_f0._M_pi);
      }
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
      }
      uVar6 = uVar6 + 1;
      lVar8 = lVar8 + 0x18;
      uVar4 = ((long)(convex_hulls->
                     super__Vector_base<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(convex_hulls->
                     super__Vector_base<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    } while (uVar6 <= uVar4 && uVar4 - uVar6 != 0);
  }
  peVar7 = (body->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  ChPhysicsItem::GetVisualModel(&peVar7->super_ChPhysicsItem);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
  }
  if ((_func_int **)local_b8._0_8_ == (_func_int **)0x0) {
    p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x40);
    local_138._0_8_ = p_Var5 + 1;
    p_Var5->_M_use_count = 1;
    p_Var5->_M_weak_count = 1;
    p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b0bf68;
    p_Var5[1]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var5[1]._M_use_count = 0;
    p_Var5[1]._M_weak_count = 0;
    p_Var5[2]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var5[2]._M_use_count = 0;
    p_Var5[2]._M_weak_count = 0;
    p_Var5[2]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var5[2]._M_use_count = 0;
    p_Var5[2]._M_weak_count = 0;
    p_Var5[3]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var5[3]._M_use_count = 0;
    p_Var5[3]._M_weak_count = 0;
    this = (body->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var5->_M_use_count = 2;
    }
    peVar7 = (element_type *)local_138;
    local_138._8_8_ = p_Var5;
    ChPhysicsItem::AddVisualModel
              (&this->super_ChPhysicsItem,(shared_ptr<chrono::ChVisualModel> *)peVar7);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_);
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
  }
  this_00 = (ChTriangleMeshShape *)ChVisualShape::operator_new((ChVisualShape *)0x98,(size_t)peVar7)
  ;
  ChTriangleMeshShape::ChTriangleMeshShape(this_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChTriangleMeshShape*>
            (&_Stack_150,this_00);
  local_108.
  super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       ((__shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2> *)
       &local_e0->super___shared_ptr<chrono::ChCamera,_(__gnu_cxx::_Lock_policy)2>)->_M_ptr;
  local_108.
  super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (((__shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2> *)
        &local_e0->super___shared_ptr<chrono::ChCamera,_(__gnu_cxx::_Lock_policy)2>)->_M_refcount).
       _M_pi;
  p_Var5 = (((__shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2> *)
            &local_e0->super___shared_ptr<chrono::ChCamera,_(__gnu_cxx::_Lock_policy)2>)->
           _M_refcount)._M_pi;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
    }
  }
  ChTriangleMeshShape::SetMesh(this_00,&local_108,true);
  if ((ChSystem *)
      local_108.
      super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (ChSystem *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_108.
               super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  std::__cxx11::string::_M_assign((string *)&this_00->name);
  auStack_120._8_8_ =
       (vis_material->super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr;
  p_Stack_110 = (vis_material->
                super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
  p_Var5 = (vis_material->super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
    }
  }
  ChVisualShape::AddMaterial
            ((ChVisualShape *)this_00,(shared_ptr<chrono::ChVisualMaterial> *)(auStack_120 + 8));
  if (p_Stack_110 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_110);
  }
  ChPhysicsItem::GetVisualModel
            (&((body->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              super_ChPhysicsItem);
  auStack_120._0_8_ = _Stack_150._M_pi;
  if (_Stack_150._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Stack_150._M_pi)->_M_use_count = (_Stack_150._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Stack_150._M_pi)->_M_use_count = (_Stack_150._M_pi)->_M_use_count + 1;
    }
  }
  local_b8._0_8_ = &PTR__ChFrame_00b03780;
  dVar1 = local_148->m_data[2];
  auVar9._8_8_ = dVar1;
  auVar9._0_8_ = dVar1;
  auVar9._16_8_ = dVar1;
  auVar9._24_8_ = dVar1;
  auVar9 = vblendps_avx(ZEXT1632(*(undefined1 (*) [16])local_148->m_data),auVar9,0x30);
  dVar1 = local_140->m_data[0];
  auVar10._8_8_ = dVar1;
  auVar10._0_8_ = dVar1;
  auVar10._16_8_ = dVar1;
  auVar10._24_8_ = dVar1;
  local_b8._8_32_ = vblendps_avx(auVar9,auVar10,0xc0);
  local_90 = local_140->m_data[1];
  dStack_88 = local_140->m_data[2];
  local_80 = local_140->m_data[3];
  local_138._16_8_ = this_00;
  ChMatrix33<double>::ChMatrix33(&local_78,local_140);
  ChVisualModel::AddShape
            (local_c8,(shared_ptr<chrono::ChVisualShape> *)(local_138 + 0x10),
             (ChFrame<double> *)local_b8);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_120._0_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_120._0_8_);
  }
  if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
  }
  if (_Stack_150._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_150._M_pi);
  }
  return;
}

Assistant:

void AddConvexCollisionModel(std::shared_ptr<ChBody> body,
                             std::shared_ptr<ChMaterialSurface> material,
                             std::shared_ptr<ChTriangleMeshConnected> convex_mesh,
                             std::vector<std::vector<ChVector<double>>>& convex_hulls,
                             const ChVector<>& pos,
                             const ChQuaternion<>& rot,
                             std::shared_ptr<ChVisualMaterial> vis_material) {
    for (int c = 0; c < convex_hulls.size(); c++) {
        body->GetCollisionModel()->AddConvexHull(material, convex_hulls[c], pos, rot);
    }

    if (!body->GetVisualModel()) {
        auto model = chrono_types::make_shared<ChVisualModel>();
        body->AddVisualModel(model);
    }

    // Add the original triangle mesh as asset
    auto trimesh_shape = chrono_types::make_shared<ChTriangleMeshShape>();
    trimesh_shape->SetMesh(convex_mesh);
    trimesh_shape->SetName(convex_mesh->GetFileName());
    trimesh_shape->AddMaterial(vis_material);
    body->GetVisualModel()->AddShape(trimesh_shape, ChFrame<>(pos, rot));
}